

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O0

void compute_stats_highbd_win7_opt_sse4_1
               (uint8_t *dgd8,uint8_t *src8,int h_start,int h_end,int v_start,int v_end,
               int dgd_stride,int src_stride,int64_t *M,int64_t *H,aom_bit_depth_t bit_depth)

{
  int iVar1;
  long lVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  long in_stack_00000018;
  long in_stack_00000020;
  int64_t *H_int_;
  int64_t *H_;
  int32_t idx0;
  int64_t avg_square_sum;
  uint8_t bit_depth_divider;
  int vert_end;
  __m128i shuffle;
  uint16_t *dgd_win;
  int32_t sumX;
  int32_t sumY [7] [7];
  int64_t H_int [49] [56];
  int64_t M_int [7] [7];
  uint16_t avg;
  uint16_t *dgd;
  uint16_t *src;
  int wiener_halfwin;
  int wiener_win2;
  int pixel_count;
  int wiener_win;
  int n;
  int m;
  int l;
  int k;
  int j;
  int i;
  int local_58d4;
  byte local_58ad;
  int local_5888 [6];
  __m128i *in_stack_ffffffffffffa790;
  int in_stack_ffffffffffffa79c;
  int in_stack_ffffffffffffa7a0;
  int in_stack_ffffffffffffa7a4;
  uint16_t *in_stack_ffffffffffffa7a8;
  uint16_t *in_stack_ffffffffffffa7b0;
  int32_t *in_stack_ffffffffffffa810;
  int32_t (*in_stack_ffffffffffffa818) [7];
  int64_t (*in_stack_ffffffffffffa820) [7];
  int64_t (*in_stack_ffffffffffffa828) [56];
  long local_57b8 [2744];
  long local_1f8 [50];
  uint16_t local_62;
  uint16_t *local_60;
  long local_58;
  undefined4 local_50;
  undefined4 local_4c;
  int local_48;
  undefined4 local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  local_44 = 7;
  local_48 = (in_ECX - in_EDX) * (in_R9D - in_R8D);
  local_4c = 0x31;
  local_50 = 3;
  local_58 = in_RSI << 1;
  local_60 = (uint16_t *)(in_RDI << 1);
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_62 = find_average_highbd(local_60,in_EDX,in_ECX,in_R8D,in_R9D,in_stack_00000008);
  memset(local_1f8,0,0x188);
  memset(local_57b8,0,0x55c0);
  memset(local_5888,0,0xc4);
  xx_loadu_128("");
  for (local_30 = local_24; local_30 < local_28; local_30 = local_30 + 0x40) {
    if (local_28 - local_30 < 0x41) {
      local_58d4 = local_28 - local_30;
    }
    else {
      local_58d4 = 0x40;
    }
    local_58d4 = local_58d4 + local_30;
    for (local_2c = local_30; local_2c < local_58d4; local_2c = local_2c + 1) {
      acc_stat_highbd_win7_one_line_sse4_1
                (in_stack_ffffffffffffa7b0,in_stack_ffffffffffffa7a8,in_stack_ffffffffffffa7a4,
                 in_stack_ffffffffffffa7a0,in_stack_ffffffffffffa79c,in_stack_ffffffffffffa790,
                 in_stack_ffffffffffffa810,in_stack_ffffffffffffa818,in_stack_ffffffffffffa820,
                 in_stack_ffffffffffffa828);
    }
  }
  local_58ad = 1;
  if ((int)H_int_ == 0xc) {
    local_58ad = 0x10;
  }
  else if ((int)H_int_ == 10) {
    local_58ad = 4;
  }
  lVar2 = (ulong)local_62 * (ulong)local_62 * (long)local_48;
  for (local_34 = 0; local_34 < 7; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < 7; local_38 = local_38 + 1) {
      iVar1 = local_38 * 7 + local_34;
      *(long *)(in_stack_00000018 + (long)iVar1 * 8) =
           (long)(local_1f8[(long)local_34 * 7 + (long)local_38] +
                 (lVar2 - (ulong)local_62 * (long)local_5888[(long)local_34 * 7 + (long)local_38]))
           / (long)(ulong)local_58ad;
      for (local_3c = 0; local_3c < 7; local_3c = local_3c + 1) {
        for (local_40 = 0; local_40 < 7; local_40 = local_40 + 1) {
          *(long *)(in_stack_00000020 + (long)(iVar1 * 0x31) * 8 +
                   (long)(local_3c * 7 + local_40) * 8) =
               (long)(local_57b8[(long)iVar1 * 0x38 + (long)(local_40 * 8 + local_3c)] +
                     (lVar2 - (ulong)local_62 *
                              (long)(local_5888[(long)local_34 * 7 + (long)local_38] +
                                    local_5888[(long)local_40 * 7 + (long)local_3c]))) /
               (long)(ulong)local_58ad;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void compute_stats_highbd_win7_opt_sse4_1(
    const uint8_t *dgd8, const uint8_t *src8, int h_start, int h_end,
    int v_start, int v_end, int dgd_stride, int src_stride, int64_t *M,
    int64_t *H, aom_bit_depth_t bit_depth) {
  int i, j, k, l, m, n;
  const int wiener_win = WIENER_WIN;
  const int pixel_count = (h_end - h_start) * (v_end - v_start);
  const int wiener_win2 = wiener_win * wiener_win;
  const int wiener_halfwin = (wiener_win >> 1);
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dgd = CONVERT_TO_SHORTPTR(dgd8);
  const uint16_t avg =
      find_average_highbd(dgd, h_start, h_end, v_start, v_end, dgd_stride);

  int64_t M_int[WIENER_WIN][WIENER_WIN] = { { 0 } };
  int64_t H_int[WIENER_WIN2][WIENER_WIN * 8] = { { 0 } };
  int32_t sumY[WIENER_WIN][WIENER_WIN] = { { 0 } };
  int32_t sumX = 0;
  const uint16_t *dgd_win = dgd - wiener_halfwin * dgd_stride - wiener_halfwin;

  // Load just half of the 256-bit shuffle control used for the AVX2 version
  const __m128i shuffle = xx_loadu_128(g_shuffle_stats_highbd_data);
  for (j = v_start; j < v_end; j += 64) {
    const int vert_end = AOMMIN(64, v_end - j) + j;
    for (i = j; i < vert_end; i++) {
      acc_stat_highbd_win7_one_line_sse4_1(
          dgd_win + i * dgd_stride, src + i * src_stride, h_start, h_end,
          dgd_stride, &shuffle, &sumX, sumY, M_int, H_int);
    }
  }

  uint8_t bit_depth_divider = 1;
  if (bit_depth == AOM_BITS_12)
    bit_depth_divider = 16;
  else if (bit_depth == AOM_BITS_10)
    bit_depth_divider = 4;

  const int64_t avg_square_sum = (int64_t)avg * (int64_t)avg * pixel_count;
  for (k = 0; k < wiener_win; k++) {
    for (l = 0; l < wiener_win; l++) {
      const int32_t idx0 = l * wiener_win + k;
      M[idx0] = (M_int[k][l] +
                 (avg_square_sum - (int64_t)avg * (sumX + sumY[k][l]))) /
                bit_depth_divider;
      int64_t *H_ = H + idx0 * wiener_win2;
      int64_t *H_int_ = &H_int[idx0][0];
      for (m = 0; m < wiener_win; m++) {
        for (n = 0; n < wiener_win; n++) {
          H_[m * wiener_win + n] =
              (H_int_[n * 8 + m] +
               (avg_square_sum - (int64_t)avg * (sumY[k][l] + sumY[n][m]))) /
              bit_depth_divider;
        }
      }
    }
  }
}